

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong uVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  void *ptr;
  BYTE *in_RCX;
  uint *in_RDX;
  long *in_RSI;
  ZSTD_matchState_t *in_RDI;
  long in_R8;
  BYTE *repEnd_3;
  BYTE *repMatch_3;
  BYTE *repBase_3;
  U32 repIndex_3;
  U32 windowLow_3;
  U32 repCurrent;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_3;
  int gain2_3;
  size_t ml2_2;
  size_t ofbCandidate_2;
  int gain1_2;
  int gain2_2;
  size_t repLength_1;
  BYTE *repEnd_2;
  BYTE *repMatch_2;
  BYTE *repBase_2;
  U32 repIndex_2;
  U32 windowLow_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t ofbCandidate_1;
  int gain1;
  int gain2;
  size_t repLength;
  BYTE *repEnd_1;
  BYTE *repMatch_1;
  BYTE *repBase_1;
  U32 repIndex_1;
  U32 windowLow_1;
  size_t step;
  size_t ml2;
  size_t ofbCandidate;
  BYTE *repEnd;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 windowLow;
  U32 curr;
  BYTE *start;
  size_t offBase;
  size_t matchLength;
  U32 offset_2;
  U32 offset_1;
  U32 rowLog;
  U32 mls;
  U32 windowLog;
  BYTE *dictStart;
  BYTE *dictEnd;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 dictLimit;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  U32 row;
  U32 hash;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog;
  BYTE *tagTable;
  U32 *hashTable;
  U32 row_1;
  U32 hash_1;
  U32 lim_1;
  U32 maxElemsToPrefetch_1;
  U32 hashLog_1;
  BYTE *tagTable_1;
  U32 *hashTable_1;
  BYTE *in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  U32 in_stack_fffffffffffff904;
  size_t *in_stack_fffffffffffff908;
  BYTE *in_stack_fffffffffffff910;
  uint in_stack_fffffffffffff918;
  uint in_stack_fffffffffffff91c;
  uint in_stack_fffffffffffff920;
  uint in_stack_fffffffffffff924;
  BYTE *in_stack_fffffffffffff928;
  BYTE *in_stack_fffffffffffff930;
  BYTE *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  uint in_stack_fffffffffffff988;
  uint in_stack_fffffffffffff98c;
  BYTE *local_638;
  size_t *local_628;
  size_t *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  BYTE *local_598;
  size_t *local_588;
  BYTE *local_510;
  size_t *local_500;
  uint local_4e0;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  uint local_4d0;
  uint local_4cc;
  BYTE *local_460;
  ulong local_440;
  int local_438;
  int local_434;
  ulong local_430;
  BYTE *local_428;
  void *local_420;
  size_t *local_418;
  uint local_410;
  U32 local_40c;
  int local_408;
  int local_404;
  size_t local_400;
  ulong local_3f8;
  int local_3f0;
  int local_3ec;
  ulong local_3e8;
  BYTE *local_3e0;
  void *local_3d8;
  size_t *local_3d0;
  uint local_3c8;
  U32 local_3c4;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  BYTE *local_3a8;
  void *local_3a0;
  size_t *local_398;
  uint local_38c;
  U32 local_388;
  U32 local_384;
  BYTE *local_380;
  ulong local_378;
  ulong local_370;
  uint local_364;
  uint local_360;
  uint local_35c;
  uint local_358;
  uint local_354;
  BYTE *local_350;
  BYTE *local_348;
  size_t *local_340;
  BYTE *local_338;
  uint local_32c;
  size_t *local_328;
  BYTE *local_320;
  BYTE *local_318;
  BYTE *local_310;
  BYTE *local_308;
  int local_2f8;
  int local_2f4;
  uint *local_2e0;
  long *local_2d8;
  ZSTD_matchState_t *local_2d0;
  ulong local_2c8;
  BYTE *local_2c0;
  BYTE *local_2b8;
  ulong local_2b0;
  undefined4 local_2a4;
  BYTE *local_2a0;
  BYTE *local_298;
  ulong local_290;
  long *local_288;
  ulong local_280;
  BYTE *local_278;
  BYTE *local_270;
  ulong local_268;
  undefined4 local_25c;
  BYTE *local_258;
  BYTE *local_250;
  ulong local_248;
  long *local_240;
  void *local_238;
  void *local_230;
  BYTE *local_228;
  long local_220;
  undefined4 local_214;
  long local_210;
  BYTE *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  BYTE *local_1e8;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  BYTE *local_1c8;
  void *local_1c0;
  int local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  U32 local_154;
  BYTE *local_150;
  U32 *local_148;
  BYTE *local_140;
  uint local_134;
  uint local_130;
  uint local_12c;
  size_t *local_128;
  ZSTD_matchState_t *local_120;
  U64 local_118;
  uint local_110;
  uint local_10c;
  long local_108;
  size_t local_100;
  uint local_d8;
  int local_d4;
  BYTE *local_d0;
  U32 *local_c8;
  undefined4 local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  ulong *local_98;
  BYTE *local_90;
  BYTE *local_88;
  ZSTD_matchState_t *local_80;
  ulong local_78;
  undefined4 local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  ulong *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ZSTD_matchState_t *local_48;
  size_t local_40;
  undefined4 local_38;
  int local_34;
  uint local_30;
  uint local_2c;
  ulong *local_28;
  BYTE *local_20;
  BYTE *local_18;
  ZSTD_matchState_t *local_10;
  ulong local_8;
  
  local_318 = in_RCX + in_R8;
  local_320 = local_318 + -8;
  local_328 = (size_t *)(in_RDI->window).base;
  local_32c = (in_RDI->window).dictLimit;
  local_338 = (BYTE *)((long)local_328 + (ulong)local_32c);
  local_340 = (size_t *)(in_RDI->window).dictBase;
  local_348 = (BYTE *)((long)local_340 + (ulong)local_32c);
  local_350 = (BYTE *)((long)local_340 + (ulong)(in_RDI->window).lowLimit);
  local_354 = (in_RDI->cParams).windowLog;
  if ((in_RDI->cParams).minMatch < 6) {
    local_4cc = (in_RDI->cParams).minMatch;
  }
  else {
    local_4cc = 6;
  }
  if (local_4cc < 4) {
    local_4d0 = 4;
  }
  else {
    if ((in_RDI->cParams).minMatch < 6) {
      local_4d4 = (in_RDI->cParams).minMatch;
    }
    else {
      local_4d4 = 6;
    }
    local_4d0 = local_4d4;
  }
  if ((in_RDI->cParams).searchLog < 6) {
    local_4d8 = (in_RDI->cParams).searchLog;
  }
  else {
    local_4d8 = 6;
  }
  if (local_4d8 < 4) {
    local_4dc = 4;
  }
  else {
    if ((in_RDI->cParams).searchLog < 6) {
      local_4e0 = (in_RDI->cParams).searchLog;
    }
    else {
      local_4e0 = 6;
    }
    local_4dc = local_4e0;
  }
  local_360 = *in_RDX;
  local_364 = in_RDX[1];
  in_RDI->lazySkipping = 0;
  local_308 = in_RCX + (int)(uint)(in_RCX == local_338);
  local_2f4 = 1;
  local_2f8 = 2;
  local_358 = local_4d0;
  local_35c = local_4dc;
  local_310 = in_RCX;
  local_2e0 = in_RDX;
  local_2d8 = in_RSI;
  local_2d0 = in_RDI;
LAB_00219ca0:
  do {
    if (local_320 <= local_308) {
      *local_2e0 = local_360;
      local_2e0[1] = local_364;
      return (long)local_318 - (long)local_310;
    }
    local_370 = 0;
    local_378 = 1;
    local_380 = local_308 + 1;
    local_384 = (int)local_308 - (int)local_328;
    local_388 = ZSTD_getLowestMatchIndex(local_2d0,local_384 + 1,local_354);
    local_38c = (local_384 + 1) - local_360;
    if (local_38c < local_32c) {
      local_500 = local_340;
    }
    else {
      local_500 = local_328;
    }
    local_398 = local_500;
    local_3a0 = (void *)((long)local_500 + (ulong)local_38c);
    if ((local_32c - 1) - local_38c < 3 || (local_384 + 1) - local_388 < local_360) {
LAB_00219eaf:
      local_3b0 = 999999999;
      local_10 = local_2d0;
      local_18 = local_308;
      local_20 = local_318;
      local_28 = &local_3b0;
      local_2c = local_358;
      local_30 = local_35c;
      local_34 = local_2f4;
      local_38 = 1;
      if (local_2f4 == 0) {
        if (local_358 == 4) {
          local_8 = ZSTD_HcFindBestMatch_extDict_4
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                               (BYTE *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980)
                               ,(BYTE *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978
                                                ),
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
        }
        else if (local_358 == 5) {
          local_8 = ZSTD_HcFindBestMatch_extDict_5
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                               (BYTE *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980)
                               ,(BYTE *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978
                                                ),
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
        }
        else {
          if (local_358 != 6) goto LAB_0021a90f;
          local_8 = ZSTD_HcFindBestMatch_extDict_6
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                               (BYTE *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980)
                               ,(BYTE *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978
                                                ),
                               (size_t *)
                               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
        }
      }
      else if (local_2f4 == 1) {
        if (local_358 == 4) {
          local_8 = ZSTD_BtFindBestMatch_extDict_4
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (BYTE *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918)
                               ,in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        }
        else if (local_358 == 5) {
          local_8 = ZSTD_BtFindBestMatch_extDict_5
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (BYTE *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918)
                               ,in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        }
        else {
          if (local_358 != 6) goto LAB_0021a90f;
          local_8 = ZSTD_BtFindBestMatch_extDict_6
                              ((ZSTD_matchState_t *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (BYTE *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918)
                               ,in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        }
      }
      else {
        if (local_2f4 != 2) {
LAB_0021a90f:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x793a,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (local_358 == 4) {
          if (local_35c == 4) {
            local_8 = ZSTD_RowFindBestMatch_extDict_4_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
          else if (local_35c == 5) {
            local_8 = ZSTD_RowFindBestMatch_extDict_4_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
          else {
            if (local_35c != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793a,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_extDict_4_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
        }
        else if (local_358 == 5) {
          if (local_35c == 4) {
            local_8 = ZSTD_RowFindBestMatch_extDict_5_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
          else if (local_35c == 5) {
            local_8 = ZSTD_RowFindBestMatch_extDict_5_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
          else {
            if (local_35c != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793a,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_extDict_5_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
        }
        else {
          if (local_358 != 6) goto LAB_0021a90f;
          if (local_35c == 4) {
            local_8 = ZSTD_RowFindBestMatch_extDict_6_4
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
          else if (local_35c == 5) {
            local_8 = ZSTD_RowFindBestMatch_extDict_6_5
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
          else {
            if (local_35c != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793a,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_8 = ZSTD_RowFindBestMatch_extDict_6_6
                                ((ZSTD_matchState_t *)
                                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8),
                                 (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                 in_stack_fffffffffffff9e8);
          }
        }
      }
      local_3b8 = local_8;
      if (local_370 < local_8) {
        local_370 = local_8;
        local_380 = local_308;
        local_378 = local_3b0;
      }
      if (local_370 < 4) {
        local_3c0 = (ulong)((long)local_308 - (long)local_310) >> 8;
        local_308 = local_308 + local_3c0 + 1;
        local_2d0->lazySkipping = (uint)(8 < local_3c0);
        goto LAB_00219ca0;
      }
      if (local_2f8 != 0) {
        while (local_308 < local_320) {
          local_308 = local_308 + 1;
          local_384 = local_384 + 1;
          if (local_378 != 0) {
            local_3c4 = ZSTD_getLowestMatchIndex(local_2d0,local_384,local_354);
            local_3c8 = local_384 - local_360;
            if (local_3c8 < local_32c) {
              local_588 = local_340;
            }
            else {
              local_588 = local_328;
            }
            local_3d0 = local_588;
            local_3d8 = (void *)((long)local_588 + (ulong)local_3c8);
            if (2 < (local_32c - 1) - local_3c8 && local_360 <= local_384 - local_3c4) {
              UVar2 = MEM_read32(local_308);
              UVar3 = MEM_read32(local_3d8);
              if (UVar2 == UVar3) {
                if (local_3c8 < local_32c) {
                  local_598 = local_348;
                }
                else {
                  local_598 = local_318;
                }
                local_3e0 = local_598;
                sVar7 = ZSTD_count_2segments
                                  (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                                   in_stack_fffffffffffff928,
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff924,
                                                    in_stack_fffffffffffff920),
                                   (BYTE *)CONCAT44(in_stack_fffffffffffff91c,
                                                    in_stack_fffffffffffff918));
                local_3e8 = sVar7 + 4;
                local_3ec = (int)local_3e8 * 3;
                iVar5 = (int)local_370;
                uVar6 = ZSTD_highbit32(0);
                local_3f0 = (iVar5 * 3 - uVar6) + 1;
                if ((3 < local_3e8) && (local_3f0 < local_3ec)) {
                  local_370 = local_3e8;
                  local_378 = 1;
                  local_380 = local_308;
                }
              }
            }
          }
          local_3f8 = 999999999;
          local_48 = local_2d0;
          local_50 = local_308;
          local_58 = local_318;
          local_60 = &local_3f8;
          local_64 = local_358;
          local_68 = local_35c;
          local_6c = local_2f4;
          local_70 = 1;
          if (local_2f4 == 0) {
            if (local_358 == 4) {
              local_40 = ZSTD_HcFindBestMatch_extDict_4
                                   ((ZSTD_matchState_t *)
                                    CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff984,
                                                     in_stack_fffffffffffff980),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff97c,
                                                     in_stack_fffffffffffff978),
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
            }
            else if (local_358 == 5) {
              local_40 = ZSTD_HcFindBestMatch_extDict_5
                                   ((ZSTD_matchState_t *)
                                    CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff984,
                                                     in_stack_fffffffffffff980),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff97c,
                                                     in_stack_fffffffffffff978),
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
            }
            else {
              if (local_358 != 6) goto LAB_0021c0e4;
              local_40 = ZSTD_HcFindBestMatch_extDict_6
                                   ((ZSTD_matchState_t *)
                                    CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff984,
                                                     in_stack_fffffffffffff980),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff97c,
                                                     in_stack_fffffffffffff978),
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
            }
          }
          else if (local_2f4 == 1) {
            if (local_358 == 4) {
              local_40 = ZSTD_BtFindBestMatch_extDict_4
                                   ((ZSTD_matchState_t *)
                                    CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff91c,
                                                     in_stack_fffffffffffff918),
                                    in_stack_fffffffffffff910,in_stack_fffffffffffff908);
            }
            else if (local_358 == 5) {
              local_40 = ZSTD_BtFindBestMatch_extDict_5
                                   ((ZSTD_matchState_t *)
                                    CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff91c,
                                                     in_stack_fffffffffffff918),
                                    in_stack_fffffffffffff910,in_stack_fffffffffffff908);
            }
            else {
              if (local_358 != 6) goto LAB_0021c0e4;
              local_40 = ZSTD_BtFindBestMatch_extDict_6
                                   ((ZSTD_matchState_t *)
                                    CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                    (BYTE *)CONCAT44(in_stack_fffffffffffff91c,
                                                     in_stack_fffffffffffff918),
                                    in_stack_fffffffffffff910,in_stack_fffffffffffff908);
            }
          }
          else {
            if (local_2f4 != 2) {
LAB_0021c0e4:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x793a,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            if (local_358 == 4) {
              if (local_35c == 4) {
                local_40 = ZSTD_RowFindBestMatch_extDict_4_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
              else if (local_35c == 5) {
                local_40 = ZSTD_RowFindBestMatch_extDict_4_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
              else {
                if (local_35c != 6) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x793a,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                local_40 = ZSTD_RowFindBestMatch_extDict_4_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
            }
            else if (local_358 == 5) {
              if (local_35c == 4) {
                local_40 = ZSTD_RowFindBestMatch_extDict_5_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
              else if (local_35c == 5) {
                local_40 = ZSTD_RowFindBestMatch_extDict_5_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
              else {
                if (local_35c != 6) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x793a,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                local_40 = ZSTD_RowFindBestMatch_extDict_5_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
            }
            else {
              if (local_358 != 6) goto LAB_0021c0e4;
              if (local_35c == 4) {
                local_40 = ZSTD_RowFindBestMatch_extDict_6_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
              else if (local_35c == 5) {
                local_40 = ZSTD_RowFindBestMatch_extDict_6_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
              else {
                if (local_35c != 6) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x793a,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                local_40 = ZSTD_RowFindBestMatch_extDict_6_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                       in_stack_fffffffffffff9f8),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                       in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              }
            }
          }
          local_400 = local_40;
          lVar8 = local_40 << 2;
          uVar6 = ZSTD_highbit32(0);
          local_404 = (int)lVar8 - uVar6;
          in_stack_fffffffffffff9e8 = (size_t *)(local_370 << 2);
          uVar6 = ZSTD_highbit32(0);
          local_408 = ((int)in_stack_fffffffffffff9e8 - uVar6) + 4;
          if ((local_400 < 4) || (local_404 <= local_408)) {
            if ((local_2f8 != 2) || (local_320 <= local_308)) break;
            local_308 = local_308 + 1;
            local_384 = local_384 + 1;
            if (local_378 != 0) {
              local_40c = ZSTD_getLowestMatchIndex(local_2d0,local_384,local_354);
              local_410 = local_384 - local_360;
              if (local_410 < local_32c) {
                local_628 = local_340;
              }
              else {
                local_628 = local_328;
              }
              local_418 = local_628;
              local_420 = (void *)((long)local_628 + (ulong)local_410);
              if (2 < (local_32c - 1) - local_410 && local_360 <= local_384 - local_40c) {
                UVar2 = MEM_read32(local_308);
                UVar3 = MEM_read32(local_420);
                if (UVar2 == UVar3) {
                  if (local_410 < local_32c) {
                    local_638 = local_348;
                  }
                  else {
                    local_638 = local_318;
                  }
                  local_428 = local_638;
                  sVar7 = ZSTD_count_2segments
                                    (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                                     in_stack_fffffffffffff928,
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff924,
                                                      in_stack_fffffffffffff920),
                                     (BYTE *)CONCAT44(in_stack_fffffffffffff91c,
                                                      in_stack_fffffffffffff918));
                  local_430 = sVar7 + 4;
                  local_434 = (int)local_430 * 4;
                  lVar8 = local_370 << 2;
                  uVar6 = ZSTD_highbit32(0);
                  local_438 = ((int)lVar8 - uVar6) + 1;
                  if ((3 < local_430) && (local_438 < local_434)) {
                    local_370 = local_430;
                    local_378 = 1;
                    local_380 = local_308;
                  }
                }
              }
            }
            local_440 = 999999999;
            local_80 = local_2d0;
            local_88 = local_308;
            local_90 = local_318;
            local_98 = &local_440;
            local_9c = local_358;
            local_a0 = local_35c;
            local_a4 = local_2f4;
            local_a8 = 1;
            if (local_2f4 == 0) {
              if (local_358 == 4) {
                local_78 = ZSTD_HcFindBestMatch_extDict_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff984,
                                                       in_stack_fffffffffffff980),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff97c,
                                                       in_stack_fffffffffffff978),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970))
                ;
              }
              else if (local_358 == 5) {
                local_78 = ZSTD_HcFindBestMatch_extDict_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff984,
                                                       in_stack_fffffffffffff980),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff97c,
                                                       in_stack_fffffffffffff978),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970))
                ;
              }
              else {
                if (local_358 != 6) goto LAB_0021d8d7;
                local_78 = ZSTD_HcFindBestMatch_extDict_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff984,
                                                       in_stack_fffffffffffff980),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff97c,
                                                       in_stack_fffffffffffff978),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970))
                ;
              }
            }
            else if (local_2f4 == 1) {
              if (local_358 == 4) {
                local_78 = ZSTD_BtFindBestMatch_extDict_4
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff91c,
                                                       in_stack_fffffffffffff918),
                                      in_stack_fffffffffffff910,in_stack_fffffffffffff908);
              }
              else if (local_358 == 5) {
                local_78 = ZSTD_BtFindBestMatch_extDict_5
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff91c,
                                                       in_stack_fffffffffffff918),
                                      in_stack_fffffffffffff910,in_stack_fffffffffffff908);
              }
              else {
                if (local_358 != 6) goto LAB_0021d8d7;
                local_78 = ZSTD_BtFindBestMatch_extDict_6
                                     ((ZSTD_matchState_t *)
                                      CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                      (BYTE *)CONCAT44(in_stack_fffffffffffff91c,
                                                       in_stack_fffffffffffff918),
                                      in_stack_fffffffffffff910,in_stack_fffffffffffff908);
              }
            }
            else {
              if (local_2f4 != 2) {
LAB_0021d8d7:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x793a,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (local_358 == 4) {
                if (local_35c == 4) {
                  local_78 = ZSTD_RowFindBestMatch_extDict_4_4
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
                else if (local_35c == 5) {
                  local_78 = ZSTD_RowFindBestMatch_extDict_4_5
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
                else {
                  if (local_35c != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793a,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_78 = ZSTD_RowFindBestMatch_extDict_4_6
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
              }
              else if (local_358 == 5) {
                in_stack_fffffffffffff98c = local_35c;
                if (local_35c == 4) {
                  local_78 = ZSTD_RowFindBestMatch_extDict_5_4
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
                else if (local_35c == 5) {
                  local_78 = ZSTD_RowFindBestMatch_extDict_5_5
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
                else {
                  if (local_35c != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793a,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_78 = ZSTD_RowFindBestMatch_extDict_5_6
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
              }
              else {
                if (local_358 != 6) goto LAB_0021d8d7;
                in_stack_fffffffffffff988 = local_35c;
                if (local_35c == 4) {
                  local_78 = ZSTD_RowFindBestMatch_extDict_6_4
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
                else if (local_35c == 5) {
                  local_78 = ZSTD_RowFindBestMatch_extDict_6_5
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
                else {
                  if (local_35c != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x793a,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_78 = ZSTD_RowFindBestMatch_extDict_6_6
                                       ((ZSTD_matchState_t *)
                                        CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00
                                                ),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (BYTE *)CONCAT44(in_stack_fffffffffffff9f4,
                                                         in_stack_fffffffffffff9f0),
                                        in_stack_fffffffffffff9e8);
                }
              }
            }
            uVar1 = local_78;
            lVar8 = local_78 << 2;
            uVar6 = ZSTD_highbit32(0);
            lVar9 = local_370 << 2;
            uVar4 = ZSTD_highbit32(0);
            if ((uVar1 < 4) || ((int)((int)lVar8 - uVar6) <= (int)(((int)lVar9 - uVar4) + 7)))
            break;
            local_370 = uVar1;
            local_378 = local_440;
            local_380 = local_308;
          }
          else {
            local_370 = local_400;
            local_378 = local_3f8;
            local_380 = local_308;
          }
        }
      }
      if (3 < local_378) {
        in_stack_fffffffffffff938 = local_380 + -(long)local_328;
        if (local_378 < 4) {
          __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7b7a,
                        "size_t ZSTD_compressBlock_lazy_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32)"
                       );
        }
        uVar6 = (int)in_stack_fffffffffffff938 - ((int)local_378 + -3);
        if (uVar6 < local_32c) {
          local_460 = (BYTE *)((long)local_340 + (ulong)uVar6);
          in_stack_fffffffffffff930 = local_460;
          in_stack_fffffffffffff928 = local_350;
        }
        else {
          local_460 = (BYTE *)((long)local_328 + (ulong)uVar6);
          in_stack_fffffffffffff930 = local_460;
          in_stack_fffffffffffff928 = local_338;
        }
        while( true ) {
          uVar6 = in_stack_fffffffffffff924 & 0xffffff;
          if ((local_310 < local_380) &&
             (uVar6 = in_stack_fffffffffffff924 & 0xffffff, in_stack_fffffffffffff928 < local_460))
          {
            uVar6 = CONCAT13(local_380[-1] == local_460[-1],(int3)in_stack_fffffffffffff924);
          }
          in_stack_fffffffffffff924 = uVar6;
          if ((char)(uVar6 >> 0x18) == '\0') break;
          local_380 = local_380 + -1;
          local_460 = local_460 + -1;
          local_370 = local_370 + 1;
        }
        local_364 = local_360;
        if (local_378 < 4) {
          __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7b7e,
                        "size_t ZSTD_compressBlock_lazy_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32)"
                       );
        }
        local_360 = (int)local_378 - 3;
      }
    }
    else {
      UVar2 = MEM_read32(local_308 + 1);
      UVar3 = MEM_read32(local_3a0);
      if (UVar2 != UVar3) goto LAB_00219eaf;
      if (local_38c < local_32c) {
        local_510 = local_348;
      }
      else {
        local_510 = local_318;
      }
      local_3a8 = local_510;
      sVar7 = ZSTD_count_2segments
                        (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                         in_stack_fffffffffffff928,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         (BYTE *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      local_370 = sVar7 + 4;
      if (local_2f8 != 0) goto LAB_00219eaf;
    }
    local_248 = (long)local_380 - (long)local_310;
    local_240 = local_2d8;
    local_250 = local_310;
    local_258 = local_318;
    local_25c = (undefined4)local_378;
    local_268 = local_370;
    local_270 = local_318 + -0x20;
    local_278 = local_310 + local_248;
    if ((ulong)local_2d8[7] <= (ulong)(local_2d8[1] - *local_2d8 >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < (ulong)local_2d8[8]) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if ((ulong)(local_2d8[2] + local_2d8[8]) < local_2d8[3] + local_248) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_318 < local_310 + local_248) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_270 < local_278) {
      ZSTD_safecopyLiterals
                (in_stack_fffffffffffff910,(BYTE *)in_stack_fffffffffffff908,
                 (BYTE *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                 in_stack_fffffffffffff8f8);
    }
    else {
      ZSTD_copy16((void *)local_2d8[3],local_310);
      if (0x10 < local_248) {
        local_230 = (void *)(local_240[3] + 0x10);
        local_228 = local_250 + 0x10;
        local_210 = local_248 - 0x10;
        local_214 = 0;
        local_220 = (long)local_230 - (long)local_228;
        local_238 = (void *)((long)local_230 + local_210);
        local_208 = local_228;
        local_200 = local_230;
        if ((local_220 < 0x10) && (-0x10 < local_220)) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(local_230,local_228);
        if (0x10 < local_210) {
          local_230 = (void *)((long)local_230 + 0x10);
          local_228 = local_228 + 0x10;
          do {
            ZSTD_copy16(local_230,local_228);
            local_230 = (void *)((long)local_230 + 0x10);
            local_228 = local_228 + 0x10;
            ZSTD_copy16(local_230,local_228);
            local_230 = (void *)((long)local_230 + 0x10);
            local_228 = local_228 + 0x10;
          } while (local_230 < local_238);
        }
      }
    }
    local_240[3] = local_248 + local_240[3];
    if (0xffff < local_248) {
      if ((int)local_240[9] != 0) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      *(undefined4 *)(local_240 + 9) = 1;
      *(int *)((long)local_240 + 0x4c) = (int)(local_240[1] - *local_240 >> 3);
    }
    *(short *)(local_240[1] + 4) = (short)local_248;
    *(undefined4 *)local_240[1] = local_25c;
    if (local_268 < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_280 = local_268 - 3;
    if (0xffff < local_280) {
      if ((int)local_240[9] != 0) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      *(undefined4 *)(local_240 + 9) = 2;
      *(int *)((long)local_240 + 0x4c) = (int)(local_240[1] - *local_240 >> 3);
    }
    *(short *)(local_240[1] + 6) = (short)local_280;
    local_240[1] = local_240[1] + 8;
    local_310 = local_380 + local_370;
    local_308 = local_310;
    if (local_2d0->lazySkipping != 0) {
      if (local_2f4 == 2) {
        in_stack_fffffffffffff91c = local_2d0->nextToUpdate;
        local_120 = local_2d0;
        local_128 = local_328;
        local_12c = local_35c;
        local_130 = local_358;
        local_140 = local_320;
        local_148 = local_2d0->hashTable;
        local_150 = local_2d0->tagTable;
        local_154 = local_2d0->rowHashLog;
        if (local_320 < (BYTE *)((long)local_328 + (ulong)in_stack_fffffffffffff91c)) {
          in_stack_fffffffffffff920 = 0;
        }
        else {
          in_stack_fffffffffffff920 =
               ((int)local_320 - ((int)local_328 + in_stack_fffffffffffff91c)) + 1;
        }
        in_stack_fffffffffffff918 = in_stack_fffffffffffff920;
        if (8 < in_stack_fffffffffffff920) {
          in_stack_fffffffffffff918 = 8;
        }
        local_15c = in_stack_fffffffffffff91c + in_stack_fffffffffffff918;
        local_158 = in_stack_fffffffffffff920;
        for (local_134 = in_stack_fffffffffffff91c; local_134 < local_15c; local_134 = local_134 + 1
            ) {
          local_108 = (long)local_128 + (ulong)local_134;
          local_10c = local_154 + 8;
          local_118 = local_120->hashSalt;
          local_110 = local_130;
          if (0x20 < local_10c) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
          }
          in_stack_fffffffffffff910 = (BYTE *)(ulong)(local_130 - 4);
          UVar2 = (U32)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
          switch(in_stack_fffffffffffff910) {
          default:
            local_100 = ZSTD_hash4PtrS((void *)CONCAT44(in_stack_fffffffffffff904,
                                                        in_stack_fffffffffffff900),UVar2,
                                       (U32)in_stack_fffffffffffff8f8);
            break;
          case (BYTE *)0x1:
            local_100 = ZSTD_hash5PtrS((void *)CONCAT44(in_stack_fffffffffffff904,
                                                        in_stack_fffffffffffff900),UVar2,0x21edbc);
            break;
          case (BYTE *)0x2:
            local_100 = ZSTD_hash6PtrS((void *)CONCAT44(in_stack_fffffffffffff904,
                                                        in_stack_fffffffffffff900),UVar2,0x21ede2);
            break;
          case (BYTE *)0x3:
            local_100 = ZSTD_hash7PtrS((void *)CONCAT44(in_stack_fffffffffffff904,
                                                        in_stack_fffffffffffff900),UVar2,0x21ee08);
            break;
          case (BYTE *)0x4:
            local_100 = ZSTD_hash8PtrS((void *)CONCAT44(in_stack_fffffffffffff904,
                                                        in_stack_fffffffffffff900),UVar2,0x21ee2e);
          }
          local_160 = (uint)local_100;
          local_164 = (local_160 >> 8) << ((byte)local_12c & 0x1f);
          local_c8 = local_148;
          local_d0 = local_150;
          local_d8 = local_12c;
          local_d4 = local_164;
          if (((local_12c != 4) && (local_12c != 5)) && (local_12c != 6)) {
            __assert_fail("rowLog == 4 || rowLog == 5 || rowLog == 6",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x76a1,
                          "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)")
            ;
          }
          iVar5 = ZSTD_isAligned((void *)CONCAT44(in_stack_fffffffffffff904,
                                                  in_stack_fffffffffffff900),
                                 (size_t)in_stack_fffffffffffff8f8);
          if (iVar5 == 0) {
            __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x76a2,
                          "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)")
            ;
          }
          iVar5 = ZSTD_isAligned((void *)CONCAT44(in_stack_fffffffffffff904,
                                                  in_stack_fffffffffffff900),
                                 (size_t)in_stack_fffffffffffff8f8);
          if (iVar5 == 0) {
            __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x76a3,
                          "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)")
            ;
          }
          local_120->hashCache[local_134 & 7] = local_160;
        }
      }
      local_2d0->lazySkipping = 0;
    }
    while (local_308 <= local_320) {
      UVar2 = (int)local_308 - (int)local_328;
      UVar3 = ZSTD_getLowestMatchIndex(local_2d0,UVar2,local_354);
      uVar6 = UVar2 - local_364;
      in_stack_fffffffffffff908 = local_328;
      if (uVar6 < local_32c) {
        in_stack_fffffffffffff908 = local_340;
      }
      ptr = (void *)((long)in_stack_fffffffffffff908 + (ulong)uVar6);
      if ((local_32c - 1) - uVar6 < 3 || UVar2 - UVar3 < local_364) break;
      in_stack_fffffffffffff904 = MEM_read32(local_308);
      UVar2 = MEM_read32(ptr);
      if (in_stack_fffffffffffff904 != UVar2) break;
      in_stack_fffffffffffff8f8 = local_318;
      if (uVar6 < local_32c) {
        in_stack_fffffffffffff8f8 = local_348;
      }
      sVar7 = ZSTD_count_2segments
                        (in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                         in_stack_fffffffffffff928,
                         (BYTE *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         (BYTE *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      uVar6 = local_364;
      local_370 = sVar7 + 4;
      local_378 = (ulong)local_364;
      local_364 = local_360;
      local_360 = uVar6;
      local_288 = local_2d8;
      local_290 = 0;
      local_298 = local_310;
      local_2a0 = local_318;
      local_2a4 = 1;
      local_2b8 = local_318 + -0x20;
      local_2c0 = local_310;
      local_2b0 = local_370;
      if ((ulong)local_2d8[7] <= (ulong)(local_2d8[1] - *local_2d8 >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < (ulong)local_2d8[8]) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if ((ulong)(local_2d8[2] + local_2d8[8]) < (ulong)local_2d8[3]) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_318 < local_310) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_2b8 < local_310) {
        ZSTD_safecopyLiterals
                  (in_stack_fffffffffffff910,(BYTE *)in_stack_fffffffffffff908,
                   (BYTE *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                   in_stack_fffffffffffff8f8);
      }
      else {
        ZSTD_copy16((void *)local_2d8[3],local_310);
        if (0x10 < local_290) {
          local_1f0 = (void *)(local_288[3] + 0x10);
          local_1e8 = local_298 + 0x10;
          local_1d0 = local_290 - 0x10;
          local_1d4 = 0;
          local_1e0 = (long)local_1f0 - (long)local_1e8;
          local_1f8 = (void *)((long)local_1f0 + local_1d0);
          local_1c8 = local_1e8;
          local_1c0 = local_1f0;
          if ((local_1e0 < 0x10) && (-0x10 < local_1e0)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(local_1f0,local_1e8);
          if (0x10 < local_1d0) {
            local_1f0 = (void *)((long)local_1f0 + 0x10);
            local_1e8 = local_1e8 + 0x10;
            do {
              ZSTD_copy16(local_1f0,local_1e8);
              local_1f0 = (void *)((long)local_1f0 + 0x10);
              local_1e8 = local_1e8 + 0x10;
              ZSTD_copy16(local_1f0,local_1e8);
              local_1f0 = (void *)((long)local_1f0 + 0x10);
              local_1e8 = local_1e8 + 0x10;
            } while (local_1f0 < local_1f8);
          }
        }
      }
      local_288[3] = local_290 + local_288[3];
      if (0xffff < local_290) {
        if ((int)local_288[9] != 0) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        *(undefined4 *)(local_288 + 9) = 1;
        *(int *)((long)local_288 + 0x4c) = (int)(local_288[1] - *local_288 >> 3);
      }
      *(short *)(local_288[1] + 4) = (short)local_290;
      *(undefined4 *)local_288[1] = local_2a4;
      if (local_2b0 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_2c8 = local_2b0 - 3;
      if (0xffff < local_2c8) {
        if ((int)local_288[9] != 0) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        *(undefined4 *)(local_288 + 9) = 2;
        *(int *)((long)local_288 + 0x4c) = (int)(local_288[1] - *local_288 >> 3);
      }
      *(short *)(local_288[1] + 6) = (short)local_2c8;
      local_288[1] = local_288[1] + 8;
      local_310 = local_308 + local_370;
      local_308 = local_310;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}